

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * BuildScript<CScript,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,opcodetype *inputs_1)

{
  opcodetype opcode;
  size_type sVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  opcode = *inputs_1;
  sVar1 = (inputs->super_CScriptBase)._size;
  pcVar3 = (inputs->super_CScriptBase)._union.indirect_contents.indirect;
  uVar4 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 8);
  uVar5 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0x14);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0xc) =
       *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x14) = uVar5;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = pcVar3;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = uVar4;
  (__return_storage_ptr__->super_CScriptBase)._size = sVar1;
  (inputs->super_CScriptBase)._size = 0;
  CScript::operator<<(__return_storage_ptr__,opcode);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}